

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall State::State(State *this)

{
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> *in_stack_fffffffffffffff0;
  
  *in_RDI = '\x01';
  in_RDI[4] = '\0';
  in_RDI[5] = '\0';
  in_RDI[6] = ' ';
  in_RDI[7] = 'A';
  in_RDI[8] = '\0';
  in_RDI[9] = '\0';
  in_RDI[10] = '\0';
  in_RDI[0xb] = '\0';
  in_RDI[0xc] = '\0';
  in_RDI[0xd] = '\0';
  in_RDI[0xe] = '\0';
  in_RDI[0xf] = '\0';
  in_RDI[0x10] = -1;
  in_RDI[0x11] = -1;
  in_RDI[0x12] = -1;
  in_RDI[0x13] = -1;
  std::
  map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
  ::map((map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
         *)0x10e68f);
  std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::vector
            ((vector<State::InputEvent,_std::allocator<State::InputEvent>_> *)0x10e6a2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0)
  ;
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  return;
}

Assistant:

State() {}